

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

void __thiscall
dg::pta::PointerAnalysisFSInv::PointerAnalysisFSInv
          (PointerAnalysisFSInv *this,PointerGraph *ps,PointerAnalysisOptions *opts)

{
  PointerAnalysisOptions *in_RDX;
  PointerAnalysisOptions *in_RSI;
  PointerGraph *in_RDI;
  PointerAnalysisFS *unaff_retaddr;
  PointerAnalysisOptions *opts_00;
  PointerGraph *ps_00;
  
  opts_00 = in_RSI;
  ps_00 = in_RDI;
  PointerAnalysisOptions::setInvalidateNodes(in_RDX,true);
  PointerAnalysisOptions::PointerAnalysisOptions(in_RSI,in_RDX);
  PointerAnalysisFS::PointerAnalysisFS(unaff_retaddr,ps_00,opts_00);
  PointerAnalysisOptions::~PointerAnalysisOptions((PointerAnalysisOptions *)0x176667);
  *(undefined ***)in_RDI = &PTR__PointerAnalysisFSInv_0019cbb0;
  return;
}

Assistant:

PointerAnalysisFSInv(PointerGraph *ps, PointerAnalysisOptions opts)
            : PointerAnalysisFS(ps, opts.setInvalidateNodes(true)) {}